

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O1

StackSize * __thiscall
miniscript::Node<CPubKey>::CalcStackSize(StackSize *__return_storage_ptr__,Node<CPubKey> *this)

{
  char cVar1;
  element_type *peVar2;
  element_type *peVar3;
  bool bVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  pointer pSVar9;
  pointer pSVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  pointer psVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  byte bVar22;
  uint uVar23;
  byte bVar24;
  int iVar25;
  int32_t iVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  long in_FS_OFFSET;
  SatInfo SVar30;
  vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_> next_sats;
  SatInfo local_88;
  vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_> local_78;
  vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  switch(this->fragment) {
  case JUST_0:
    (__return_storage_ptr__->sat).valid = false;
    *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = 0;
    (__return_storage_ptr__->sat).netdiff = 0;
    (__return_storage_ptr__->sat).exec = 0;
    (__return_storage_ptr__->dsat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->dsat).field_0x1 = 0;
    (__return_storage_ptr__->dsat).netdiff = -1;
    (__return_storage_ptr__->dsat).exec = 0;
    break;
  case JUST_1:
  case OLDER:
  case AFTER:
    (__return_storage_ptr__->sat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = 0;
    (__return_storage_ptr__->sat).netdiff = -1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      *(undefined8 *)&(__return_storage_ptr__->sat).exec = 0;
      (__return_storage_ptr__->dsat).netdiff = 0;
      (__return_storage_ptr__->dsat).exec = 0;
      return __return_storage_ptr__;
    }
    goto LAB_001ab87a;
  case PK_K:
    lVar16 = -0xffffffff;
    (__return_storage_ptr__->sat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = 0;
    (__return_storage_ptr__->sat).netdiff = -1;
    iVar14 = 0;
    goto LAB_001aabe9;
  case PK_H:
    lVar16 = 1;
    (__return_storage_ptr__->sat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = 0;
    (__return_storage_ptr__->sat).netdiff = 0;
    iVar14 = 2;
    goto LAB_001aabe9;
  case SHA256:
  case HASH256:
  case RIPEMD160:
  case HASH160:
    (__return_storage_ptr__->sat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->sat).field_0x1 = 0;
    (__return_storage_ptr__->sat).netdiff = 0;
    (__return_storage_ptr__->sat).exec = 2;
    goto LAB_001ab479;
  case WRAP_A:
  case WRAP_S:
  case WRAP_N:
    peVar3 = (((this->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      *(undefined8 *)&(__return_storage_ptr__->dsat).netdiff =
           *(undefined8 *)((long)&peVar3->ss + 0x10);
      uVar5 = *(undefined8 *)&(peVar3->ss).sat;
      uVar6 = *(undefined8 *)((long)&peVar3->ss + 8);
      (__return_storage_ptr__->sat).valid = (bool)(char)uVar5;
      *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)((ulong)uVar5 >> 8);
      (__return_storage_ptr__->sat).netdiff = (int)((ulong)uVar5 >> 0x20);
      *(undefined8 *)&(__return_storage_ptr__->sat).exec = uVar6;
      return __return_storage_ptr__;
    }
    goto LAB_001ab87a;
  case WRAP_C:
    peVar3 = (((this->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    iVar14 = 0;
    if ((peVar3->ss).sat.valid == '\x01') {
      iVar21 = *(int32_t *)((long)&peVar3->ss + 8);
      iVar12 = 0;
      if (0 < iVar21) {
        iVar12 = iVar21;
      }
      iVar12 = iVar12 + 1;
      uVar29 = (ulong)(*(int32_t *)((long)&peVar3->ss + 4) + 1) << 0x20;
      uVar19 = 1;
    }
    else {
      uVar29 = 0;
      uVar19 = 0;
      iVar12 = 0;
    }
    uVar29 = uVar29 | uVar19;
    if (((SatInfo *)((long)&peVar3->ss + 0xc))->valid == true) {
      iVar21 = *(int32_t *)((long)&peVar3->ss + 0x14);
      iVar14 = 0;
      if (0 < iVar21) {
        iVar14 = iVar21;
      }
      iVar14 = iVar14 + 1;
      uVar20 = (ulong)(*(int32_t *)((long)&peVar3->ss + 0x10) + 1) << 0x20;
      uVar19 = 1;
    }
    else {
      uVar20 = 0;
      uVar19 = 0;
    }
    uVar20 = uVar20 | uVar19;
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar29;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)(uVar29 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)(uVar29 >> 0x20);
    (__return_storage_ptr__->sat).exec = iVar12;
    (__return_storage_ptr__->dsat).valid = (bool)(char)uVar20;
    *(int3 *)&(__return_storage_ptr__->dsat).field_0x1 = (int3)(uVar20 >> 8);
    (__return_storage_ptr__->dsat).netdiff = (int)(uVar20 >> 0x20);
    (__return_storage_ptr__->dsat).exec = iVar14;
    break;
  case WRAP_D:
  case WRAP_J:
    peVar3 = (((this->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    if ((peVar3->ss).sat.valid == '\x01') {
      uVar23 = *(int32_t *)((long)&peVar3->ss + 4);
      iVar12 = *(int32_t *)((long)&peVar3->ss + 8);
      iVar14 = uVar23 + 1;
      if (iVar14 < iVar12) {
        iVar14 = iVar12;
      }
      uVar29 = (ulong)uVar23 << 0x20;
      uVar19 = 1;
    }
    else {
      uVar29 = 0;
      uVar19 = 0;
      iVar14 = 0;
    }
    uVar29 = uVar29 | uVar19;
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar29;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)(uVar29 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)(uVar29 >> 0x20);
    (__return_storage_ptr__->sat).exec = iVar14;
    (__return_storage_ptr__->dsat).valid = true;
    *(undefined3 *)&(__return_storage_ptr__->dsat).field_0x1 = 0;
    (__return_storage_ptr__->dsat).netdiff = 0;
    (__return_storage_ptr__->dsat).exec = 1;
    break;
  case WRAP_V:
    peVar3 = (((this->subs).
               super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    if ((peVar3->ss).sat.valid != '\x01') goto LAB_001aacfe;
    iVar14 = *(int32_t *)((long)&peVar3->ss + 8);
    uVar23 = *(int32_t *)((long)&peVar3->ss + 4) + 1;
    iVar12 = 0;
    if (0 < iVar14) {
      iVar12 = iVar14;
    }
    iVar14 = iVar12 + 1;
LAB_001aacf3:
    uVar29 = (ulong)uVar23 << 0x20;
    uVar19 = 1;
    goto LAB_001aad04;
  case AND_V:
    psVar18 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar3 = (psVar18->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    if (((peVar3->ss).sat.valid == '\x01') &&
       (peVar2 = psVar18[1].
                 super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr, (peVar2->ss).sat.valid == '\x01')) {
      iVar14 = *(int32_t *)((long)&peVar2->ss + 4);
      iVar12 = *(int32_t *)((long)&peVar2->ss + 8);
      uVar23 = *(int32_t *)((long)&peVar3->ss + 4) + iVar14;
      iVar14 = iVar14 + *(int32_t *)((long)&peVar3->ss + 8);
      if (iVar14 < iVar12) {
        iVar14 = iVar12;
      }
      goto LAB_001aacf3;
    }
LAB_001aacfe:
    uVar29 = 0;
    uVar19 = 0;
    iVar14 = 0;
LAB_001aad04:
    uVar29 = uVar29 | uVar19;
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar29;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)(uVar29 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)(uVar29 >> 0x20);
    (__return_storage_ptr__->sat).exec = iVar14;
    goto LAB_001ab479;
  case AND_B:
    uVar19 = 0x100000000;
    psVar18 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar3 = (psVar18->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    peVar2 = psVar18[1].
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    uVar20 = 0;
    iVar12 = 1;
    uVar29 = 0x100000000;
    bVar4 = false;
    iVar14 = 1;
    if ((peVar3->ss).sat.valid == '\x01') {
      if ((peVar2->ss).sat.valid == '\x01') {
        iVar21 = *(int32_t *)((long)&peVar2->ss + 4);
        iVar14 = iVar21 + *(int32_t *)((long)&peVar3->ss + 8);
        iVar25 = *(int32_t *)((long)&peVar2->ss + 8);
        if (iVar14 < iVar25) {
          iVar14 = iVar25;
        }
        iVar14 = iVar14 + 1;
        uVar29 = (ulong)(iVar21 + *(int32_t *)((long)&peVar3->ss + 4) + 1) << 0x20;
        bVar4 = true;
      }
      else {
        bVar4 = false;
        uVar29 = 0x100000000;
      }
    }
    if (iVar14 < 2) {
      iVar14 = 1;
    }
    if (!bVar4) {
      iVar14 = 0;
      uVar29 = uVar20;
    }
    uVar29 = bVar4 | uVar29;
    if (((SatInfo *)((long)&peVar3->ss + 0xc))->valid == true) {
      if (((SatInfo *)((long)&peVar2->ss + 0xc))->valid == true) {
        iVar21 = *(int32_t *)((long)&peVar2->ss + 0x10);
        iVar12 = iVar21 + *(int32_t *)((long)&peVar3->ss + 0x14);
        iVar25 = *(int32_t *)((long)&peVar2->ss + 0x14);
        if (iVar12 < iVar25) {
          iVar12 = iVar25;
        }
        iVar12 = iVar12 + 1;
        uVar19 = (ulong)(*(int32_t *)((long)&peVar3->ss + 0x10) + iVar21 + 1) << 0x20;
        uVar20 = 1;
      }
      else {
        uVar20 = 0;
      }
    }
    iVar21 = 1;
    if (1 < iVar12) {
      iVar21 = iVar12;
    }
    if ((char)uVar20 == '\0') {
      iVar21 = 0;
      uVar19 = 0;
    }
    uVar20 = uVar20 | uVar19;
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar29;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)(uVar29 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)(uVar29 >> 0x20);
    (__return_storage_ptr__->sat).exec = iVar14;
    (__return_storage_ptr__->dsat).valid = (bool)(char)uVar20;
    *(int3 *)&(__return_storage_ptr__->dsat).field_0x1 = (int3)(uVar20 >> 8);
    (__return_storage_ptr__->dsat).netdiff = (int)(uVar20 >> 0x20);
    (__return_storage_ptr__->dsat).exec = iVar21;
    break;
  case OR_B:
    psVar18 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar3 = (psVar18->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    peVar2 = psVar18[1].
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar14 = 0;
    if (((peVar3->ss).sat.valid == '\x01') &&
       (((SatInfo *)((long)&peVar2->ss + 0xc))->valid == true)) {
      iVar12 = *(int32_t *)((long)&peVar2->ss + 0x10);
      iVar25 = *(int32_t *)((long)&peVar2->ss + 0x14);
      iVar21 = *(int32_t *)((long)&peVar3->ss + 4) + iVar12;
      iVar12 = iVar12 + *(int32_t *)((long)&peVar3->ss + 8);
      if (iVar12 < iVar25) {
        iVar12 = iVar25;
      }
      bVar4 = true;
    }
    else {
      iVar21 = 0;
      bVar4 = false;
      iVar12 = 0;
    }
    cVar1 = ((SatInfo *)((long)&peVar3->ss + 0xc))->valid;
    if (cVar1 == '\x01') {
      if ((peVar2->ss).sat.valid == '\x01') {
        iVar14 = *(int32_t *)((long)&peVar2->ss + 4);
        iVar15 = *(int32_t *)((long)&peVar2->ss + 8);
        iVar25 = *(int32_t *)((long)&peVar3->ss + 0x10) + iVar14;
        iVar14 = iVar14 + *(int32_t *)((long)&peVar3->ss + 0x14);
        if (iVar14 < iVar15) {
          iVar14 = iVar15;
        }
        bVar8 = true;
      }
      else {
        iVar25 = 0;
        bVar8 = false;
        iVar14 = 0;
      }
    }
    else {
      iVar25 = 0;
      bVar8 = false;
    }
    iVar15 = iVar25;
    iVar13 = iVar14;
    bVar7 = bVar8;
    if ((bVar4) && (iVar15 = iVar21, iVar13 = iVar12, bVar7 = bVar4, bVar8)) {
      if (iVar25 < iVar21) {
        iVar25 = iVar21;
      }
      if (iVar14 < iVar12) {
        iVar14 = iVar12;
      }
      iVar15 = iVar25;
      iVar13 = iVar14;
      bVar7 = true;
    }
    if (bVar7) {
      iVar14 = 0;
      if (0 < iVar13) {
        iVar14 = iVar13;
      }
      iVar26 = iVar14 + 1;
      uVar19 = (ulong)(iVar15 + 1) << 0x20;
      uVar29 = 1;
    }
    else {
      uVar19 = 0;
      uVar29 = 0;
      iVar26 = 0;
    }
    uVar19 = uVar19 | uVar29;
    uVar29 = 0x100000000;
    if ((cVar1 == '\0') || (((SatInfo *)((long)&peVar2->ss + 0xc))->valid != true)) {
      bVar11 = 0;
      iVar14 = 1;
    }
    else {
      iVar12 = *(int32_t *)((long)&peVar2->ss + 0x10);
      iVar14 = iVar12 + *(int32_t *)((long)&peVar3->ss + 0x14);
      iVar21 = *(int32_t *)((long)&peVar2->ss + 0x14);
      if (iVar14 < iVar21) {
        iVar14 = iVar21;
      }
      iVar14 = iVar14 + 1;
      uVar29 = (ulong)(*(int32_t *)((long)&peVar3->ss + 0x10) + iVar12 + 1) << 0x20;
      bVar11 = 1;
    }
    iVar12 = 1;
    if (1 < iVar14) {
      iVar12 = iVar14;
    }
    if (bVar11 == 0) {
      uVar29 = 0;
    }
    if (bVar11 == 0) {
      iVar12 = 0;
    }
    uVar29 = bVar11 | uVar29;
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar19;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)(uVar19 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)(uVar19 >> 0x20);
    (__return_storage_ptr__->sat).exec = iVar26;
    (__return_storage_ptr__->dsat).valid = (bool)(char)uVar29;
    *(int3 *)&(__return_storage_ptr__->dsat).field_0x1 = (int3)(uVar29 >> 8);
    (__return_storage_ptr__->dsat).netdiff = (int)(uVar29 >> 0x20);
    (__return_storage_ptr__->dsat).exec = iVar12;
    break;
  case OR_C:
    psVar18 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar3 = (psVar18->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    iVar14 = 0;
    if ((peVar3->ss).sat.valid == '\x01') {
      iVar21 = *(int32_t *)((long)&peVar3->ss + 8);
      uVar23 = *(int32_t *)((long)&peVar3->ss + 4) + 1;
      iVar12 = 0;
      if (0 < iVar21) {
        iVar12 = iVar21;
      }
      iVar12 = iVar12 + 1;
      uVar29 = 1;
    }
    else {
      uVar23 = 0;
      uVar29 = 0;
      iVar12 = 0;
    }
    cVar1 = ((SatInfo *)((long)&peVar3->ss + 0xc))->valid;
    iVar21 = 0;
    if (cVar1 == '\x01') {
      iVar25 = *(int32_t *)((long)&peVar3->ss + 0x14);
      iVar14 = *(int32_t *)((long)&peVar3->ss + 0x10) + 1;
      iVar21 = 0;
      if (0 < iVar25) {
        iVar21 = iVar25;
      }
      iVar21 = iVar21 + 1;
    }
    if ((cVar1 == '\0') ||
       (peVar3 = psVar18[1].
                 super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr, (peVar3->ss).sat.valid != '\x01')) {
      uVar27 = 0;
      uVar19 = 0;
      iVar21 = 0;
    }
    else {
      iVar25 = *(int32_t *)((long)&peVar3->ss + 4);
      iVar15 = *(int32_t *)((long)&peVar3->ss + 8);
      uVar27 = iVar14 + iVar25;
      iVar21 = iVar21 + iVar25;
      if (iVar21 < iVar15) {
        iVar21 = iVar15;
      }
      uVar19 = 1;
    }
    uVar20 = uVar19;
    iVar14 = iVar21;
    uVar28 = uVar27;
    if ((uVar29 != 0) && (uVar20 = uVar29, iVar14 = iVar12, uVar28 = uVar23, uVar19 != 0)) {
      if ((int)uVar27 < (int)uVar23) {
        uVar27 = uVar23;
      }
      if (iVar21 < iVar12) {
        iVar21 = iVar12;
      }
      uVar20 = 1;
      iVar14 = iVar21;
      uVar28 = uVar27;
    }
    uVar20 = uVar20 | (ulong)uVar28 << 0x20;
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar20;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)(uVar20 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)(uVar20 >> 0x20);
    (__return_storage_ptr__->sat).exec = iVar14;
LAB_001ab479:
    (__return_storage_ptr__->dsat).valid = false;
    *(undefined3 *)&(__return_storage_ptr__->dsat).field_0x1 = 0;
    (__return_storage_ptr__->dsat).netdiff = 0;
    (__return_storage_ptr__->dsat).exec = 0;
    break;
  case OR_D:
    psVar18 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar3 = (psVar18->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    bVar11 = (peVar3->ss).sat.valid;
    iVar14 = 0;
    if (bVar11 == 1) {
      uVar23 = *(int32_t *)((long)&peVar3->ss + 4);
      iVar21 = *(int32_t *)((long)&peVar3->ss + 8);
      iVar12 = 1;
      if (1 < iVar21) {
        iVar12 = iVar21;
      }
    }
    else {
      uVar23 = 0;
      iVar12 = 0;
    }
    cVar1 = ((SatInfo *)((long)&peVar3->ss + 0xc))->valid;
    iVar21 = 0;
    if (cVar1 == '\x01') {
      iVar21 = *(int32_t *)((long)&peVar3->ss + 0x14);
      iVar14 = 0;
      if (0 < iVar21) {
        iVar14 = iVar21;
      }
      iVar21 = *(int32_t *)((long)&peVar3->ss + 0x10) + 1;
      iVar14 = iVar14 + 1;
    }
    peVar2 = psVar18[1].
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((cVar1 == '\0') || ((peVar2->ss).sat.valid != '\x01')) {
      uVar27 = 0;
      bVar22 = 0;
      iVar14 = 0;
    }
    else {
      iVar25 = *(int32_t *)((long)&peVar2->ss + 4);
      iVar15 = *(int32_t *)((long)&peVar2->ss + 8);
      uVar27 = iVar21 + iVar25;
      iVar14 = iVar14 + iVar25;
      if (iVar14 < iVar15) {
        iVar14 = iVar15;
      }
      bVar22 = 1;
    }
    iVar21 = iVar14;
    bVar24 = bVar22;
    uVar28 = uVar27;
    if ((bVar11 != 0) && (iVar21 = iVar12, bVar24 = bVar11, uVar28 = uVar23, bVar22 != 0)) {
      if ((int)uVar27 < (int)uVar23) {
        uVar27 = uVar23;
      }
      if (iVar14 < iVar12) {
        iVar14 = iVar12;
      }
      iVar21 = iVar14;
      bVar24 = 1;
      uVar28 = uVar27;
    }
    iVar14 = 0;
    iVar12 = 0;
    iVar25 = 0;
    if (cVar1 != '\0') {
      iVar25 = *(int32_t *)((long)&peVar3->ss + 0x14);
      iVar12 = 0;
      if (0 < iVar25) {
        iVar12 = iVar25;
      }
      iVar25 = *(int32_t *)((long)&peVar3->ss + 0x10) + 1;
      iVar12 = iVar12 + 1;
    }
    uVar29 = (ulong)uVar28 << 0x20 | (ulong)bVar24;
    if (cVar1 == '\0') {
      uVar20 = 0;
      uVar19 = 0;
    }
    else if (((SatInfo *)((long)&peVar2->ss + 0xc))->valid == true) {
      iVar15 = *(int32_t *)((long)&peVar2->ss + 0x10);
      iVar13 = *(int32_t *)((long)&peVar2->ss + 0x14);
      iVar14 = iVar12 + iVar15;
      if (iVar14 < iVar13) {
        iVar14 = iVar13;
      }
      uVar20 = (ulong)(uint)(iVar25 + iVar15) << 0x20;
      uVar19 = 1;
    }
    else {
      uVar20 = 0;
      uVar19 = 0;
      iVar14 = 0;
    }
    uVar20 = uVar20 | uVar19;
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar29;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)(uVar29 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)(uVar29 >> 0x20);
    (__return_storage_ptr__->sat).exec = iVar21;
    (__return_storage_ptr__->dsat).valid = (bool)(char)uVar20;
    *(int3 *)&(__return_storage_ptr__->dsat).field_0x1 = (int3)(uVar20 >> 8);
    (__return_storage_ptr__->dsat).netdiff = (int)(uVar20 >> 0x20);
    (__return_storage_ptr__->dsat).exec = iVar14;
    break;
  case OR_I:
    psVar18 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar3 = (psVar18->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    peVar2 = psVar18[1].
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    SVar30 = internal::operator|(&(peVar3->ss).sat,&(peVar2->ss).sat);
    uVar23 = 0;
    if (((undefined1  [12])SVar30 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
      uVar19 = 0;
      uVar29 = 0;
      uVar27 = 0;
    }
    else {
      uVar28 = SVar30.netdiff + 1;
      uVar27 = SVar30.exec;
      if (SVar30.exec <= (int)uVar28) {
        uVar27 = uVar28;
      }
      uVar19 = (ulong)uVar28 << 0x20;
      uVar29 = 1;
    }
    uVar19 = uVar19 | uVar29;
    SVar30 = internal::operator|((SatInfo *)((long)&peVar3->ss + 0xc),
                                 (SatInfo *)((long)&peVar2->ss + 0xc));
    if (((undefined1  [12])SVar30 & (undefined1  [12])0x1) == (undefined1  [12])0x0) {
      uVar29 = 0;
      uVar20 = 0;
    }
    else {
      uVar28 = SVar30.netdiff + 1;
      uVar23 = SVar30.exec;
      if (SVar30.exec <= (int)uVar28) {
        uVar23 = uVar28;
      }
      uVar29 = (ulong)uVar28 << 0x20;
      uVar20 = 1;
    }
    uVar29 = uVar29 | uVar20;
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar19;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)(uVar19 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)(uVar19 >> 0x20);
    (__return_storage_ptr__->sat).exec = uVar27;
    (__return_storage_ptr__->dsat).valid = (bool)(char)uVar29;
    *(int3 *)&(__return_storage_ptr__->dsat).field_0x1 = (int3)(uVar29 >> 8);
    (__return_storage_ptr__->dsat).netdiff = (int)(uVar29 >> 0x20);
    (__return_storage_ptr__->dsat).exec = uVar23;
    break;
  case ANDOR:
    psVar18 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    peVar3 = (psVar18->
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    cVar1 = (peVar3->ss).sat.valid;
    iVar14 = 0;
    iVar21 = 0;
    iVar12 = 0;
    if (cVar1 == '\x01') {
      iVar25 = *(int32_t *)((long)&peVar3->ss + 8);
      iVar21 = *(int32_t *)((long)&peVar3->ss + 4) + 1;
      iVar12 = 0;
      if (0 < iVar25) {
        iVar12 = iVar25;
      }
      iVar12 = iVar12 + 1;
    }
    if (cVar1 == '\0') {
      uVar23 = 0;
      uVar29 = 0;
    }
    else {
      peVar2 = psVar18[1].
               super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if ((peVar2->ss).sat.valid == '\x01') {
        iVar14 = *(int32_t *)((long)&peVar2->ss + 4);
        iVar25 = *(int32_t *)((long)&peVar2->ss + 8);
        uVar23 = iVar21 + iVar14;
        iVar14 = iVar12 + iVar14;
        if (iVar14 < iVar25) {
          iVar14 = iVar25;
        }
        uVar29 = 1;
      }
      else {
        uVar23 = 0;
        uVar29 = 0;
        iVar14 = 0;
      }
    }
    cVar1 = ((SatInfo *)((long)&peVar3->ss + 0xc))->valid;
    iVar12 = 0;
    iVar25 = 0;
    iVar21 = 0;
    if (cVar1 == '\x01') {
      iVar15 = *(int32_t *)((long)&peVar3->ss + 0x14);
      iVar25 = *(int32_t *)((long)&peVar3->ss + 0x10) + 1;
      iVar21 = 0;
      if (0 < iVar15) {
        iVar21 = iVar15;
      }
      iVar21 = iVar21 + 1;
    }
    peVar2 = psVar18[2].
             super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (cVar1 == '\0') {
      uVar27 = 0;
      uVar19 = 0;
    }
    else if ((peVar2->ss).sat.valid == '\x01') {
      iVar12 = *(int32_t *)((long)&peVar2->ss + 4);
      iVar15 = *(int32_t *)((long)&peVar2->ss + 8);
      uVar27 = iVar25 + iVar12;
      iVar12 = iVar21 + iVar12;
      if (iVar12 < iVar15) {
        iVar12 = iVar15;
      }
      uVar19 = 1;
    }
    else {
      uVar27 = 0;
      uVar19 = 0;
      iVar12 = 0;
    }
    uVar20 = uVar19;
    iVar21 = iVar12;
    uVar28 = uVar27;
    if ((uVar29 != 0) && (uVar20 = uVar29, iVar21 = iVar14, uVar28 = uVar23, uVar19 != 0)) {
      if ((int)uVar27 < (int)uVar23) {
        uVar27 = uVar23;
      }
      if (iVar12 < iVar14) {
        iVar12 = iVar14;
      }
      uVar20 = 1;
      iVar21 = iVar12;
      uVar28 = uVar27;
    }
    iVar14 = 0;
    iVar25 = 0;
    iVar12 = 0;
    if (cVar1 != '\0') {
      iVar15 = *(int32_t *)((long)&peVar3->ss + 0x14);
      iVar25 = *(int32_t *)((long)&peVar3->ss + 0x10) + 1;
      iVar12 = 0;
      if (0 < iVar15) {
        iVar12 = iVar15;
      }
      iVar12 = iVar12 + 1;
    }
    uVar20 = (ulong)uVar28 << 0x20 | uVar20;
    if (cVar1 == '\0') {
      uVar19 = 0;
      uVar29 = 0;
    }
    else if (((SatInfo *)((long)&peVar2->ss + 0xc))->valid == true) {
      iVar15 = *(int32_t *)((long)&peVar2->ss + 0x10);
      iVar13 = *(int32_t *)((long)&peVar2->ss + 0x14);
      iVar14 = iVar12 + iVar15;
      if (iVar14 < iVar13) {
        iVar14 = iVar13;
      }
      uVar19 = (ulong)(uint)(iVar25 + iVar15) << 0x20;
      uVar29 = 1;
    }
    else {
      uVar19 = 0;
      uVar29 = 0;
      iVar14 = 0;
    }
    uVar19 = uVar19 | uVar29;
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar20;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)(uVar20 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)(uVar20 >> 0x20);
    (__return_storage_ptr__->sat).exec = iVar21;
    (__return_storage_ptr__->dsat).valid = (bool)(char)uVar19;
    *(int3 *)&(__return_storage_ptr__->dsat).field_0x1 = (int3)(uVar19 >> 8);
    (__return_storage_ptr__->dsat).netdiff = (int)(uVar19 >> 0x20);
    (__return_storage_ptr__->dsat).exec = iVar14;
    break;
  case THRESH:
    local_78.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
    local_78.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)local_78.
                          super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
    local_58.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = (SatInfo *)0x0;
    local_58.
    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (SatInfo *)0x0;
    std::vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>::
    reserve(&local_58,1);
    if (local_58.
        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_58.
        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>::
      _M_realloc_insert<miniscript::internal::SatInfo>
                (&local_58,
                 (iterator)
                 local_58.
                 super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(SatInfo *)&local_78);
    }
    else {
      (local_58.
       super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish)->exec =
           (int32_t)local_78.
                    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
      *(pointer *)
       local_58.
       super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
       ._M_impl.super__Vector_impl_data._M_finish =
           local_78.
           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_58.
      super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_58.
           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    psVar18 = (this->subs).
              super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->subs).
        super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar18) {
      uVar29 = 0;
      do {
        uVar23 = (uint)(uVar29 != 0);
        iVar12 = 0;
        bVar4 = false;
        iVar14 = 0;
        if ((local_58.
             super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
             ._M_impl.super__Vector_impl_data._M_start)->valid == true) {
          peVar3 = psVar18[uVar29].
                   super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar12 = 0;
          if ((peVar3->ss).dsat.valid == true) {
            iVar14 = (peVar3->ss).dsat.netdiff;
            iVar21 = (peVar3->ss).dsat.exec;
            iVar12 = (local_58.
                      super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start)->netdiff + iVar14;
            iVar14 = iVar14 + (local_58.
                               super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start)->exec;
            if (iVar14 < iVar21) {
              iVar14 = iVar21;
            }
            bVar4 = true;
          }
        }
        uVar27 = (uint)(uVar29 != 0);
        if (bVar4) {
          local_88.exec = iVar14 + uVar23;
          if ((int)(iVar14 + uVar23) < (int)uVar27) {
            local_88.exec = uVar27;
          }
          local_88._0_8_ = (ulong)(iVar12 + uVar23) << 0x20;
          uVar19 = 1;
        }
        else {
          local_88._0_8_ = 0;
          uVar19 = 0;
          local_88.exec = 0;
        }
        local_88._0_8_ = local_88._0_8_ | uVar19;
        local_78.
        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.
        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = (SatInfo *)0x0;
        local_78.
        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (SatInfo *)0x0;
        std::vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>::
        reserve(&local_78,1);
        if (local_78.
            super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_78.
            super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
          ::_M_realloc_insert<miniscript::internal::SatInfo>
                    (&local_78,
                     (iterator)
                     local_78.
                     super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_88);
        }
        else {
          (local_78.
           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)->exec = local_88.exec;
          (local_78.
           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)->valid = local_88.valid;
          *(undefined3 *)
           &(local_78.
             super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish)->field_0x1 = local_88._1_3_;
          (local_78.
           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)->netdiff = local_88.netdiff;
          local_78.
          super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_78.
               super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        lVar16 = (long)local_58.
                       super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_58.
                       super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        if (1 < (ulong)((lVar16 >> 2) * -0x5555555555555555)) {
          uVar19 = 1;
          lVar17 = 0x14;
          do {
            peVar3 = (this->subs).
                     super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar29].
                     super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            iVar14 = 0;
            if ((*(char *)((long)local_58.
                                 super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar17 + -8) == '\x01')
               && (((SatInfo *)((long)&peVar3->ss + 0xc))->valid == true)) {
              iVar12 = *(int32_t *)((long)&peVar3->ss + 0x10);
              iVar25 = *(int32_t *)((long)&peVar3->ss + 0x14);
              iVar21 = *(int *)((long)local_58.
                                      super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar17 + -4) +
                       iVar12;
              iVar12 = iVar12 + *(int *)(&(local_58.
                                           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->valid +
                                        lVar17);
              if (iVar12 < iVar25) {
                iVar12 = iVar25;
              }
              bVar4 = true;
            }
            else {
              iVar21 = 0;
              bVar4 = false;
              iVar12 = 0;
            }
            if (*(char *)((long)local_58.
                                super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar17 + -0x14) ==
                '\x01') {
              if ((peVar3->ss).sat.valid == '\x01') {
                iVar14 = *(int32_t *)((long)&peVar3->ss + 4);
                iVar15 = *(int32_t *)((long)&peVar3->ss + 8);
                iVar25 = *(int *)((long)local_58.
                                        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar17 + -0x10)
                         + iVar14;
                iVar14 = iVar14 + *(int *)(&local_58.
                                            super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                            ._M_impl.super__Vector_impl_data._M_start[-1].valid +
                                          lVar17);
                if (iVar14 < iVar15) {
                  iVar14 = iVar15;
                }
                bVar8 = true;
              }
              else {
                iVar25 = 0;
                bVar8 = false;
                iVar14 = 0;
              }
            }
            else {
              iVar25 = 0;
              bVar8 = false;
            }
            iVar15 = iVar25;
            iVar13 = iVar14;
            bVar7 = bVar8;
            if ((bVar4) && (iVar15 = iVar21, iVar13 = iVar12, bVar7 = bVar4, bVar8)) {
              if (iVar25 < iVar21) {
                iVar25 = iVar21;
              }
              if (iVar14 < iVar12) {
                iVar14 = iVar12;
              }
              iVar15 = iVar25;
              iVar13 = iVar14;
              bVar7 = true;
            }
            if (bVar7) {
              local_88.exec = iVar13 + uVar23;
              if ((int)(iVar13 + uVar23) < (int)uVar27) {
                local_88.exec = uVar27;
              }
              local_88._0_8_ = (ulong)(iVar15 + uVar23) << 0x20;
              uVar20 = 1;
            }
            else {
              local_88._0_8_ = 0;
              uVar20 = 0;
              local_88.exec = 0;
            }
            local_88._0_8_ = local_88._0_8_ | uVar20;
            if (local_78.
                super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish ==
                local_78.
                super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
              ::_M_realloc_insert<miniscript::internal::SatInfo>
                        (&local_78,
                         (iterator)
                         local_78.
                         super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&local_88);
            }
            else {
              (local_78.
               super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish)->exec = local_88.exec;
              (local_78.
               super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish)->valid = (bool)(char)local_88._0_8_;
              *(int3 *)&(local_78.
                         super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->field_0x1 =
                   (int3)((ulong)local_88._0_8_ >> 8);
              (local_78.
               super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish)->netdiff =
                   (int)((ulong)local_88._0_8_ >> 0x20);
              local_78.
              super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   local_78.
                   super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish + 1;
            }
            uVar19 = uVar19 + 1;
            lVar16 = (long)local_58.
                           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_58.
                           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                           ._M_impl.super__Vector_impl_data._M_start;
            lVar17 = lVar17 + 0xc;
          } while (uVar19 < (ulong)((lVar16 >> 2) * -0x5555555555555555));
        }
        local_88.exec = 0;
        iVar12 = 0;
        bVar4 = false;
        iVar14 = 0;
        if ((&local_58.
              super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[-1].valid)[lVar16] == true) {
          peVar3 = (this->subs).
                   super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar29].
                   super___shared_ptr<const_miniscript::Node<CPubKey>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar12 = 0;
          bVar4 = false;
          if ((peVar3->ss).sat.valid == '\x01') {
            iVar14 = *(int32_t *)((long)&peVar3->ss + 4);
            iVar21 = *(int32_t *)((long)&peVar3->ss + 8);
            iVar12 = *(int *)((long)local_58.
                                    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_start + lVar16 + -8) +
                     iVar14;
            iVar14 = iVar14 + *(int *)((long)local_58.
                                             super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar16 + -4
                                      );
            if (iVar14 < iVar21) {
              iVar14 = iVar21;
            }
            bVar4 = true;
          }
        }
        if (bVar4) {
          local_88.exec = iVar14 + uVar23;
          if ((int)(iVar14 + uVar23) < (int)uVar27) {
            local_88.exec = uVar27;
          }
          local_88._0_8_ = (ulong)(iVar12 + uVar23) << 0x20;
          uVar19 = 1;
        }
        else {
          local_88._0_8_ = 0;
          uVar19 = 0;
        }
        local_88._0_8_ = local_88._0_8_ | uVar19;
        if (local_78.
            super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_78.
            super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
          ::_M_realloc_insert<miniscript::internal::SatInfo>
                    (&local_78,
                     (iterator)
                     local_78.
                     super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_88);
        }
        else {
          (local_78.
           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)->exec = local_88.exec;
          (local_78.
           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)->valid = (bool)(char)local_88._0_8_;
          *(int3 *)&(local_78.
                     super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish)->field_0x1 =
               (int3)((ulong)local_88._0_8_ >> 8);
          (local_78.
           super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)->netdiff =
               (int)((ulong)local_88._0_8_ >> 0x20);
          local_78.
          super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_78.
               super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
        pSVar10 = local_58.
                  super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pSVar9 = local_58.
                 super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_58.
        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
        ._M_impl.super__Vector_impl_data._M_start =
             local_78.
             super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_58.
        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_78.
             super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_58.
        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             local_78.
             super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_78.
        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_78.
        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_78.
        super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pSVar9 != (pointer)0x0) {
          operator_delete(pSVar9,(long)pSVar10 - (long)pSVar9);
        }
        if (local_78.
            super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_78.
                          super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_78.
                                super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_78.
                                super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        uVar29 = uVar29 + 1;
        psVar18 = (this->subs).
                  super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      } while (uVar29 < (ulong)((long)(this->subs).
                                      super__Vector_base<std::shared_ptr<const_miniscript::Node<CPubKey>_>,_std::allocator<std::shared_ptr<const_miniscript::Node<CPubKey>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar18 >>
                               4));
    }
    uVar23 = this->k;
    iVar14 = 0;
    if ((ulong)local_58.
               super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar23].valid == 1) {
      iVar12 = 1;
      if (1 < local_58.
              super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar23].exec) {
        iVar12 = local_58.
                 super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar23].exec;
      }
      uVar29 = (ulong)(uint)local_58.
                            super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar23].netdiff << 0x20;
    }
    else {
      iVar12 = 0;
      uVar29 = 0;
    }
    uVar29 = uVar29 | local_58.
                      super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar23].valid;
    if ((ulong)(local_58.
                super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                ._M_impl.super__Vector_impl_data._M_start)->valid == 1) {
      iVar14 = 1;
      if (1 < (local_58.
               super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
               ._M_impl.super__Vector_impl_data._M_start)->exec) {
        iVar14 = (local_58.
                  super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start)->exec;
      }
      uVar19 = (ulong)(uint)(local_58.
                             super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                             ._M_impl.super__Vector_impl_data._M_start)->netdiff << 0x20;
    }
    else {
      uVar19 = 0;
    }
    uVar19 = uVar19 | (local_58.
                       super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start)->valid;
    (__return_storage_ptr__->sat).valid = (bool)(char)uVar29;
    *(int3 *)&(__return_storage_ptr__->sat).field_0x1 = (int3)(uVar29 >> 8);
    (__return_storage_ptr__->sat).netdiff = (int)(uVar29 >> 0x20);
    (__return_storage_ptr__->sat).exec = iVar12;
    (__return_storage_ptr__->dsat).valid = (bool)(char)uVar19;
    *(int3 *)&(__return_storage_ptr__->dsat).field_0x1 = (int3)(uVar19 >> 8);
    (__return_storage_ptr__->dsat).netdiff = (int)(uVar19 >> 0x20);
    (__return_storage_ptr__->dsat).exec = iVar14;
    operator_delete(local_58.
                    super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<miniscript::internal::SatInfo,_std::allocator<miniscript::internal::SatInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    break;
  case MULTI:
    iVar14 = (*(int *)&(this->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                       super__Vector_impl_data._M_finish -
             *(int *)&(this->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                      super__Vector_impl_data._M_start) * -0x3f03f03f + this->k + 2;
    lVar16 = ((ulong)this->k << 0x20) + 1;
    *(long *)&__return_storage_ptr__->sat = lVar16;
LAB_001aabe9:
    (__return_storage_ptr__->sat).exec = iVar14;
    (__return_storage_ptr__->dsat).valid = (bool)(char)lVar16;
    *(int3 *)&(__return_storage_ptr__->dsat).field_0x1 = (int3)((ulong)lVar16 >> 8);
    (__return_storage_ptr__->dsat).netdiff = (int)((ulong)lVar16 >> 0x20);
    (__return_storage_ptr__->dsat).exec = iVar14;
    break;
  case MULTI_A:
    lVar16 = ((long)(this->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->keys).super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.
                   super__Vector_impl_data._M_start) * 0xfc0fc0fc0fc0fc1;
    lVar17 = (lVar16 << 0x20) + -0xffffffff;
    *(long *)&__return_storage_ptr__->sat = lVar17;
    iVar26 = (int32_t)lVar16;
    (__return_storage_ptr__->sat).exec = iVar26;
    *(long *)&__return_storage_ptr__->dsat = lVar17;
    (__return_storage_ptr__->dsat).exec = iVar26;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                  ,0x452,
                  "internal::StackSize miniscript::Node<CPubKey>::CalcStackSize() const [Key = CPubKey]"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_001ab87a:
  __stack_chk_fail();
}

Assistant:

internal::StackSize CalcStackSize() const {
        using namespace internal;
        switch (fragment) {
            case Fragment::JUST_0: return {{}, SatInfo::Push()};
            case Fragment::JUST_1: return {SatInfo::Push(), {}};
            case Fragment::OLDER:
            case Fragment::AFTER: return {SatInfo::Push() + SatInfo::Nop(), {}};
            case Fragment::PK_K: return {SatInfo::Push()};
            case Fragment::PK_H: return {SatInfo::OP_DUP() + SatInfo::Hash() + SatInfo::Push() + SatInfo::OP_EQUALVERIFY()};
            case Fragment::SHA256:
            case Fragment::RIPEMD160:
            case Fragment::HASH256:
            case Fragment::HASH160: return {
                SatInfo::OP_SIZE() + SatInfo::Push() + SatInfo::OP_EQUALVERIFY() + SatInfo::Hash() + SatInfo::Push() + SatInfo::OP_EQUAL(),
                {}
            };
            case Fragment::ANDOR: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                const auto& z{subs[2]->ss};
                return {
                    (x.sat + SatInfo::If() + y.sat) | (x.dsat + SatInfo::If() + z.sat),
                    x.dsat + SatInfo::If() + z.dsat
                };
            }
            case Fragment::AND_V: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {x.sat + y.sat, {}};
            }
            case Fragment::AND_B: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {x.sat + y.sat + SatInfo::BinaryOp(), x.dsat + y.dsat + SatInfo::BinaryOp()};
            }
            case Fragment::OR_B: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {
                    ((x.sat + y.dsat) | (x.dsat + y.sat)) + SatInfo::BinaryOp(),
                    x.dsat + y.dsat + SatInfo::BinaryOp()
                };
            }
            case Fragment::OR_C: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {(x.sat + SatInfo::If()) | (x.dsat + SatInfo::If() + y.sat), {}};
            }
            case Fragment::OR_D: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {
                    (x.sat + SatInfo::OP_IFDUP(true) + SatInfo::If()) | (x.dsat + SatInfo::OP_IFDUP(false) + SatInfo::If() + y.sat),
                    x.dsat + SatInfo::OP_IFDUP(false) + SatInfo::If() + y.dsat
                };
            }
            case Fragment::OR_I: {
                const auto& x{subs[0]->ss};
                const auto& y{subs[1]->ss};
                return {SatInfo::If() + (x.sat | y.sat), SatInfo::If() + (x.dsat | y.dsat)};
            }
            // multi(k, key1, key2, ..., key_n) starts off with k+1 stack elements (a 0, plus k
            // signatures), then reaches n+k+3 stack elements after pushing the n keys, plus k and
            // n itself, and ends with 1 stack element (success or failure). Thus, it net removes
            // k elements (from k+1 to 1), while reaching k+n+2 more than it ends with.
            case Fragment::MULTI: return {SatInfo(k, k + keys.size() + 2)};
            // multi_a(k, key1, key2, ..., key_n) starts off with n stack elements (the
            // signatures), reaches 1 more (after the first key push), and ends with 1. Thus it net
            // removes n-1 elements (from n to 1) while reaching n more than it ends with.
            case Fragment::MULTI_A: return {SatInfo(keys.size() - 1, keys.size())};
            case Fragment::WRAP_A:
            case Fragment::WRAP_N:
            case Fragment::WRAP_S: return subs[0]->ss;
            case Fragment::WRAP_C: return {
                subs[0]->ss.sat + SatInfo::OP_CHECKSIG(),
                subs[0]->ss.dsat + SatInfo::OP_CHECKSIG()
            };
            case Fragment::WRAP_D: return {
                SatInfo::OP_DUP() + SatInfo::If() + subs[0]->ss.sat,
                SatInfo::OP_DUP() + SatInfo::If()
            };
            case Fragment::WRAP_V: return {subs[0]->ss.sat + SatInfo::OP_VERIFY(), {}};
            case Fragment::WRAP_J: return {
                SatInfo::OP_SIZE() + SatInfo::OP_0NOTEQUAL() + SatInfo::If() + subs[0]->ss.sat,
                SatInfo::OP_SIZE() + SatInfo::OP_0NOTEQUAL() + SatInfo::If()
            };
            case Fragment::THRESH: {
                // sats[j] is the SatInfo corresponding to all traces reaching j satisfactions.
                auto sats = Vector(SatInfo::Empty());
                for (size_t i = 0; i < subs.size(); ++i) {
                    // Loop over the subexpressions, processing them one by one. After adding
                    // element i we need to add OP_ADD (if i>0).
                    auto add = i ? SatInfo::BinaryOp() : SatInfo::Empty();
                    // Construct a variable that will become the next sats, starting with index 0.
                    auto next_sats = Vector(sats[0] + subs[i]->ss.dsat + add);
                    // Then loop to construct next_sats[1..i].
                    for (size_t j = 1; j < sats.size(); ++j) {
                        next_sats.push_back(((sats[j] + subs[i]->ss.dsat) | (sats[j - 1] + subs[i]->ss.sat)) + add);
                    }
                    // Finally construct next_sats[i+1].
                    next_sats.push_back(sats[sats.size() - 1] + subs[i]->ss.sat + add);
                    // Switch over.
                    sats = std::move(next_sats);
                }
                // To satisfy thresh we need k satisfactions; to dissatisfy we need 0. In both
                // cases a push of k and an OP_EQUAL follow.
                return {
                    sats[k] + SatInfo::Push() + SatInfo::OP_EQUAL(),
                    sats[0] + SatInfo::Push() + SatInfo::OP_EQUAL()
                };
            }
        }
        assert(false);
    }